

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<int,int,char,int,char[4]>
          (Capturer *this,size_t index,int *value,int *values,char *values_1,int *values_2,
          char (*values_3) [4])

{
  string local_50;
  
  Detail::stringify<int>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<int,char,int,char[4]>(this,index + 1,values,values_1,values_2,values_3);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }